

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O3

IndexPair slang::IntervalMapDetails::distribute
                    (uint32_t numNodes,uint32_t numElements,uint32_t capacity,uint32_t *newSizes,
                    uint32_t position)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar5 = 0;
  uVar3 = 0;
  uVar6 = 0;
  uVar4 = numNodes;
  do {
    uVar1 = (numElements + 1) / numNodes +
            (uint)(uVar5 < (ulong)(numElements + 1) % (ulong)numNodes);
    newSizes[uVar5] = uVar1;
    uVar2 = uVar1 + uVar6;
    if (uVar4 == numNodes && position < uVar2) {
      uVar3 = (ulong)(position - uVar6);
      uVar4 = (uint32_t)uVar5;
    }
    uVar5 = uVar5 + 1;
    uVar6 = uVar2;
  } while (numNodes != (uint32_t)uVar5);
  newSizes[uVar4] = newSizes[uVar4] - 1;
  return (IndexPair)(uVar3 << 0x20 | (ulong)uVar4);
}

Assistant:

IndexPair distribute(uint32_t numNodes, uint32_t numElements, uint32_t capacity, uint32_t* newSizes,
                     uint32_t position) {
    SLANG_ASSERT(numElements + 1 <= numNodes * capacity);
    SLANG_ASSERT(position <= numElements);
    SLANG_ASSERT(numNodes > 0);

    // left-leaning even distribution
    const uint32_t perNode = (numElements + 1) / numNodes;
    const uint32_t extra = (numElements + 1) % numNodes;
    IndexPair posPair(numNodes, 0);
    uint32_t sum = 0;
    for (uint32_t n = 0; n != numNodes; ++n) {
        sum += newSizes[n] = perNode + (n < extra);
        if (posPair.first == numNodes && sum > position)
            posPair = {n, position - (sum - newSizes[n])};
    }

    // Subtract the new element that was added.
    SLANG_ASSERT(sum == numElements + 1);
    SLANG_ASSERT(posPair.first < numNodes);
    SLANG_ASSERT(newSizes[posPair.first]);
    --newSizes[posPair.first];

    return posPair;
}